

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1540.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  transfer_status st;
  long local_38 [4];
  
  tv_test_start = tutil_tvnow();
  local_38[0] = 0;
  local_38[1] = 0;
  local_38[2] = 0;
  iVar1 = curl_global_init(3);
  uVar5 = _stderr;
  if (iVar1 != 0) {
    uVar2 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar5,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1540.c"
                  ,0x5f,iVar1,uVar2);
    goto LAB_0010251c;
  }
  lVar3 = curl_easy_init();
  if (lVar3 == 0) {
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1540.c"
                  ,0x61);
    iVar1 = 0x7c;
  }
  else {
    local_38[0] = lVar3;
    iVar1 = curl_easy_setopt(lVar3,0x2712,URL);
    uVar5 = _stderr;
    if (iVar1 == 0) {
      iVar1 = curl_easy_setopt(lVar3,0x4e2b,write_callback);
      uVar5 = _stderr;
      if (iVar1 == 0) {
        iVar1 = curl_easy_setopt(lVar3,0x2711,local_38);
        uVar5 = _stderr;
        if (iVar1 == 0) {
          iVar1 = curl_easy_setopt(lVar3,0x4e6f,header_callback);
          uVar5 = _stderr;
          if (iVar1 == 0) {
            iVar1 = curl_easy_setopt(lVar3,0x272d,local_38);
            uVar5 = _stderr;
            if (iVar1 == 0) {
              iVar1 = curl_easy_setopt(lVar3,0x4efb,please_continue);
              uVar5 = _stderr;
              if (iVar1 == 0) {
                iVar1 = curl_easy_setopt(lVar3,0x2749,local_38);
                uVar5 = _stderr;
                if (iVar1 == 0) {
                  iVar1 = curl_easy_setopt(lVar3,0x2b,0);
                  uVar5 = _stderr;
                  if (iVar1 == 0) {
                    iVar1 = curl_easy_perform(lVar3);
                    goto LAB_0010250f;
                  }
                  uVar2 = curl_easy_strerror(iVar1);
                  uVar4 = 0x6c;
                }
                else {
                  uVar2 = curl_easy_strerror(iVar1);
                  uVar4 = 0x6b;
                }
              }
              else {
                uVar2 = curl_easy_strerror(iVar1);
                uVar4 = 0x6a;
              }
            }
            else {
              uVar2 = curl_easy_strerror(iVar1);
              uVar4 = 0x68;
            }
          }
          else {
            uVar2 = curl_easy_strerror(iVar1);
            uVar4 = 0x67;
          }
        }
        else {
          uVar2 = curl_easy_strerror(iVar1);
          uVar4 = 0x66;
        }
      }
      else {
        uVar2 = curl_easy_strerror(iVar1);
        uVar4 = 0x65;
      }
    }
    else {
      uVar2 = curl_easy_strerror(iVar1);
      uVar4 = 100;
    }
    curl_mfprintf(uVar5,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1540.c"
                  ,uVar4,iVar1,uVar2);
  }
LAB_0010250f:
  curl_easy_cleanup(lVar3);
  curl_global_cleanup();
LAB_0010251c:
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *curls = NULL;
  int i = 0;
  int res = 0;
  struct transfer_status st;

  start_test_timing();

  memset(&st, 0, sizeof(st));

  global_init(CURL_GLOBAL_ALL);

  easy_init(curls);
  st.easy = curls; /* to allow callbacks access */

  easy_setopt(curls, CURLOPT_URL, URL);
  easy_setopt(curls, CURLOPT_WRITEFUNCTION, write_callback);
  easy_setopt(curls, CURLOPT_WRITEDATA, &st);
  easy_setopt(curls, CURLOPT_HEADERFUNCTION, header_callback);
  easy_setopt(curls, CURLOPT_HEADERDATA, &st);

  easy_setopt(curls, CURLOPT_XFERINFOFUNCTION, please_continue);
  easy_setopt(curls, CURLOPT_XFERINFODATA, &st);
  easy_setopt(curls, CURLOPT_NOPROGRESS, 0L);

  res = curl_easy_perform(curls);

test_cleanup:

  curl_easy_cleanup(curls);
  curl_global_cleanup();

  if(res)
    i = res;

  return i; /* return the final return code */
}